

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O0

deBool deFile_setFlags(deFile *file,deUint32 flags)

{
  int iVar1;
  uint local_34;
  uint local_30;
  int newFlags_1;
  int oldFlags_1;
  int newFlags;
  int oldFlags;
  deUint32 flags_local;
  deFile *file_local;
  
  local_30 = fcntl(file->fd,3,0);
  if ((flags & 1) == 0) {
    local_30 = local_30 & 0xfffff7ff;
  }
  else {
    local_30 = local_30 | 0x800;
  }
  iVar1 = fcntl(file->fd,4,(ulong)local_30);
  if (iVar1 == 0) {
    local_34 = fcntl(file->fd,1,0);
    if ((flags & 2) == 0) {
      local_34 = local_34 & 0xfffffffe;
    }
    else {
      local_34 = local_34 | 1;
    }
    iVar1 = fcntl(file->fd,2,(ulong)local_34);
    if (iVar1 == 0) {
      file_local._4_4_ = 1;
    }
    else {
      file_local._4_4_ = 0;
    }
  }
  else {
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

deBool deFile_setFlags (deFile* file, deUint32 flags)
{
	/* Non-blocking. */
	{
		int oldFlags = fcntl(file->fd, F_GETFL, 0);
		int newFlags = (flags & DE_FILE_NONBLOCKING) ? (oldFlags | O_NONBLOCK) : (oldFlags & ~O_NONBLOCK);
		if (fcntl(file->fd, F_SETFL, newFlags) != 0)
			return DE_FALSE;
	}

	/* Close on exec. */
	{
		int oldFlags = fcntl(file->fd, F_GETFD, 0);
		int newFlags = (flags & DE_FILE_CLOSE_ON_EXEC) ? (oldFlags | FD_CLOEXEC) : (oldFlags & ~FD_CLOEXEC);
		if (fcntl(file->fd, F_SETFD, newFlags) != 0)
			return DE_FALSE;
	}

	return DE_TRUE;
}